

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask11_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long unaff_RBP;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x5c5044382c201408));
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[0xf] << 5)));
  vpmovsxbd_avx(ZEXT416(0x3024180c));
  auVar2 = vpsrlvd_avx2(auVar5._0_16_,_DAT_00192dc0);
  auVar1 = vpsllvd_avx2(auVar5,_DAT_0018f7a0);
  auVar4 = vpshufd_avx(auVar5._16_16_,0xe9);
  auVar3 = vpsrlvd_avx2(auVar4,_DAT_00192de0);
  auVar4 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[0xf] << 5)));
  auVar4 = vpsllvd_avx2(auVar4,_DAT_001919f0);
  auVar4 = vpor_avx(auVar4,auVar2);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar4),ZEXT1632(auVar4),7);
  auVar4 = vpinsrd_avx(ZEXT416(in[0x12]),in[0x15],1);
  auVar4 = vpsllvd_avx2(auVar4,_DAT_00191a00);
  auVar4 = vpor_avx(auVar4,auVar3);
  vpmovsxbd_avx2(ZEXT816(0x584c4034281c1004));
  auVar9._0_8_ = auVar4._0_8_;
  auVar9._8_8_ = auVar9._0_8_;
  auVar9._16_8_ = auVar9._0_8_;
  auVar9._24_8_ = auVar9._0_8_;
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar7 = vpsllvd_avx2(auVar7,_DAT_0018f760);
  auVar6 = vpblendd_avx2(auVar6,ZEXT432(*in),1);
  auVar8 = vpbroadcastd_avx512vl();
  auVar6 = vpblendd_avx2(auVar6,auVar8,0x20);
  auVar6 = vpblendd_avx2(auVar6,auVar9,0xc0);
  auVar6 = vpternlogd_avx512vl(auVar1,auVar7,auVar6,0xfe);
  *(undefined1 (*) [32])out = auVar6;
  out[8] = auVar5._28_4_ >> 3;
  return out + 9;
}

Assistant:

uint32_t *__fastpackwithoutmask11_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (11 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (11 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (11 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (11 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (11 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (11 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (11 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (11 - 8);
  ++in;

  return out + 1;
}